

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::minorInitialiseDevexFramework(HEkkDual *this)

{
  HighsInt i;
  HEkkDual *this_local;
  
  for (i = 0; i < this->multi_num; i = i + 1) {
    this->multi_choice[i].infeasEdWt = 1.0;
  }
  this->minor_new_devex_framework = false;
  return;
}

Assistant:

void HEkkDual::minorInitialiseDevexFramework() {
  // Set the local Devex weights to 1
  for (HighsInt i = 0; i < multi_num; i++) {
    multi_choice[i].infeasEdWt = 1.0;
  }
  minor_new_devex_framework = false;
}